

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFileHourly.cpp
# Opt level: O0

void __thiscall liblogger::LogFileHourly::RemoveOld(LogFileHourly *this)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  int *piVar4;
  undefined8 uVar5;
  size_t sVar6;
  string *psVar7;
  long lVar8;
  long lVar9;
  LogException *this_00;
  string *message;
  long in_RDI;
  stringstream ss_4;
  stringstream ss2_1;
  stringstream ss_3;
  stringstream ss_2;
  string file;
  int time;
  string prefix;
  string fname;
  dirent *info;
  int oldest;
  stringstream ss2;
  stringstream ss_1;
  char strtime [1024];
  tm timeinfo;
  time_t current;
  stringstream ss;
  DIR *d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee28;
  string *in_stack_ffffffffffffee38;
  LogException *in_stack_ffffffffffffee40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee48;
  allocator<char> *in_stack_ffffffffffffee50;
  char *in_stack_ffffffffffffee58;
  undefined4 in_stack_ffffffffffffee60;
  undefined4 in_stack_ffffffffffffee64;
  stringstream local_10a8 [16];
  ostream local_1098 [383];
  undefined1 local_f19;
  undefined1 local_ef1;
  stringstream local_ed0 [16];
  ostream local_ec0 [376];
  stringstream local_d48 [16];
  ostream local_d38 [383];
  undefined1 local_bb9;
  stringstream local_b98 [16];
  ostream local_b88 [376];
  string local_a10 [32];
  string local_9f0 [36];
  int local_9cc;
  string local_9c8 [39];
  allocator<char> local_9a1;
  string local_9a0 [32];
  dirent *local_980;
  int local_978;
  undefined1 local_971;
  undefined1 local_949;
  stringstream local_928 [16];
  ostream local_918 [376];
  stringstream local_7a0 [16];
  ostream local_790 [376];
  char local_618 [1032];
  tm local_210;
  time_t local_1d8;
  undefined1 local_1c9;
  stringstream local_198 [16];
  ostream local_188 [376];
  DIR *local_10;
  
  if (0 < *(int *)(in_RDI + 0x48)) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_10 = opendir(pcVar2);
    if (local_10 == (DIR *)0x0) {
      std::__cxx11::stringstream::stringstream(local_198);
      poVar3 = std::operator<<(local_188,"Unable to open directory \'");
      poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 8));
      poVar3 = std::operator<<(poVar3,"\' error:");
      piVar4 = __errno_location();
      pcVar2 = strerror(*piVar4);
      std::operator<<(poVar3,pcVar2);
      local_1c9 = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38);
      local_1c9 = 0;
      __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
    }
    local_1d8 = ::time((time_t *)0x0);
    localtime_r(&local_1d8,&local_210);
    sVar6 = strftime(local_618,0x400,"%Y%m%d%H",&local_210);
    if (sVar6 == 0) {
      std::__cxx11::stringstream::stringstream(local_7a0);
      poVar3 = std::operator<<(local_790,"strftime failed: \'");
      poVar3 = std::operator<<(poVar3,"\' error: ");
      piVar4 = __errno_location();
      pcVar2 = strerror(*piVar4);
      std::operator<<(poVar3,pcVar2);
      iVar1 = closedir(local_10);
      if (-1 < iVar1) {
        local_971 = 1;
        uVar5 = __cxa_allocate_exception(0x28);
        std::__cxx11::stringstream::str();
        LogException::LogException(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38);
        local_971 = 0;
        __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
      }
      std::__cxx11::stringstream::stringstream(local_928);
      poVar3 = std::operator<<(local_918,"Unable to close directory \'");
      poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 8));
      poVar3 = std::operator<<(poVar3,"\' error:");
      piVar4 = __errno_location();
      pcVar2 = strerror(*piVar4);
      std::operator<<(poVar3,pcVar2);
      local_949 = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38);
      local_949 = 0;
      __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
    }
    local_978 = 0;
    iVar1 = __isoc99_sscanf(local_618,"%d",&local_978);
    if (iVar1 != 1) {
      abort();
    }
    local_978 = local_978 - *(int *)(in_RDI + 0x48);
    while( true ) {
      piVar4 = __errno_location();
      *piVar4 = 0;
      local_980 = readdir(local_10);
      if (local_980 == (dirent *)0x0) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                 in_stack_ffffffffffffee58,in_stack_ffffffffffffee50);
      std::allocator<char>::~allocator(&local_9a1);
      std::operator+(in_stack_ffffffffffffee48,(char *)in_stack_ffffffffffffee40);
      psVar7 = (string *)std::__cxx11::string::length();
      iVar1 = std::__cxx11::string::compare((ulong)local_9a0,0,psVar7);
      if (iVar1 == 0) {
        local_9cc = 0;
        lVar8 = std::__cxx11::string::c_str();
        lVar9 = std::__cxx11::string::length();
        iVar1 = __isoc99_sscanf(lVar8 + lVar9,"%d",&local_9cc);
        if ((iVar1 == 1) && (local_9cc < local_978)) {
          std::operator+(in_stack_ffffffffffffee48,(char *)in_stack_ffffffffffffee40);
          std::operator+(in_stack_ffffffffffffee28,in_stack_ffffffffffffee20);
          std::__cxx11::string::~string(local_a10);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          iVar1 = unlink(pcVar2);
          if (iVar1 < 0) {
            std::__cxx11::stringstream::stringstream(local_b98);
            poVar3 = std::operator<<(local_b88,"Unable to remove file \'");
            pcVar2 = (char *)std::__cxx11::string::c_str();
            poVar3 = std::operator<<(poVar3,pcVar2);
            poVar3 = std::operator<<(poVar3,"\' error:");
            piVar4 = __errno_location();
            pcVar2 = strerror(*piVar4);
            std::operator<<(poVar3,pcVar2);
            local_bb9 = 1;
            uVar5 = __cxa_allocate_exception(0x28);
            std::__cxx11::stringstream::str();
            LogException::LogException(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38);
            local_bb9 = 0;
            __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
          }
          std::__cxx11::string::~string(local_9f0);
        }
      }
      std::__cxx11::string::~string(local_9c8);
      std::__cxx11::string::~string(local_9a0);
    }
    piVar4 = __errno_location();
    if (*piVar4 != 0) {
      std::__cxx11::stringstream::stringstream(local_d48);
      poVar3 = std::operator<<(local_d38,"readdir failed in \'");
      poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 8));
      poVar3 = std::operator<<(poVar3,"\' error:");
      piVar4 = __errno_location();
      pcVar2 = strerror(*piVar4);
      std::operator<<(poVar3,pcVar2);
      iVar1 = closedir(local_10);
      if (-1 < iVar1) {
        local_f19 = 1;
        message = (string *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringstream::str();
        LogException::LogException(in_stack_ffffffffffffee40,message);
        local_f19 = 0;
        __cxa_throw(message,&LogException::typeinfo,LogException::~LogException);
      }
      std::__cxx11::stringstream::stringstream(local_ed0);
      poVar3 = std::operator<<(local_ec0,"Unable to close directory \'");
      poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 8));
      poVar3 = std::operator<<(poVar3,"\' error:");
      piVar4 = __errno_location();
      pcVar2 = strerror(*piVar4);
      std::operator<<(poVar3,pcVar2);
      local_ef1 = 1;
      this_00 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException(this_00,in_stack_ffffffffffffee38);
      local_ef1 = 0;
      __cxa_throw(this_00,&LogException::typeinfo,LogException::~LogException);
    }
    iVar1 = closedir(local_10);
    if (iVar1 < 0) {
      std::__cxx11::stringstream::stringstream(local_10a8);
      poVar3 = std::operator<<(local_1098,"Unable to close directory \'");
      poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 8));
      poVar3 = std::operator<<(poVar3,"\' error:");
      piVar4 = __errno_location();
      pcVar2 = strerror(*piVar4);
      std::operator<<(poVar3,pcVar2);
      uVar5 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38);
      __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
    }
  }
  return;
}

Assistant:

void LogFileHourly::RemoveOld()
{

	if (m_maxage <= 0)
		return;

	DIR *d = opendir(m_dir.c_str());
	if (d == NULL)
	{
		std::stringstream ss;
		ss << "Unable to open directory '" << m_dir << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}

	time_t current = time(NULL);
	struct tm timeinfo;
	char strtime[1024];

	localtime_r(&current, &timeinfo);

	if (strftime(strtime, sizeof(strtime), "%Y%m%d%H", &timeinfo) == 0)
	{
		std::stringstream ss;
		ss << "strftime failed: '" << "' error: " << strerror(errno);
		if (closedir(d) < 0)
		{
			std::stringstream ss2;
			ss2 << "Unable to close directory '" << m_dir << "' error:" << strerror(errno);
			throw(LogException(ss2.str()));
		}
		throw(LogException(ss.str()));
	}

	int oldest = 0;
	if (sscanf(strtime, "%d", &oldest) != 1)
		abort();
	oldest -= m_maxage;

	while(1)
	{
		errno = 0;
		struct dirent *info = readdir(d);
		if (info == NULL)
			break; //EOF
		std::string fname = info->d_name;
		std::string prefix = m_prefix + "-";
		if (fname.compare(0, prefix.length(), prefix) == 0)
		{
			//Parse and comare time.
			int time = 0;
			if (sscanf(&fname.c_str()[prefix.length()], "%d", &time) == 1)
			{
				if (time < oldest)
				{
					std::string file = m_dir + "/" + fname;
					if (unlink(file.c_str()) < 0)
					{
						std::stringstream ss;
						ss << "Unable to remove file '" << file.c_str() << "' error:" << strerror(errno);
						throw(LogException(ss.str()));
					}
				}
			}
			else
			{
				//Cant parse
			}
		}
	}

	if (errno != 0)
	{
		std::stringstream ss;
		ss << "readdir failed in '" << m_dir << "' error:" << strerror(errno);
		if (closedir(d) < 0)
		{
			std::stringstream ss2;
			ss2 << "Unable to close directory '" << m_dir << "' error:" << strerror(errno);
			throw(LogException(ss2.str()));
		}
		throw(LogException(ss.str()));
	}

	if (closedir(d) < 0)
	{
		std::stringstream ss;
		ss << "Unable to close directory '" << m_dir << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
}